

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileInputSource.cc
# Opt level: O3

void __thiscall FileInputSource::FileInputSource(FileInputSource *this,char *filename)

{
  FILE *pFVar1;
  allocator<char> local_11;
  
  (this->super_InputSource).last_offset = 0;
  (this->super_InputSource).buf_len = 0;
  (this->super_InputSource).buf_idx = 0;
  (this->super_InputSource).buf_start = 0;
  (this->super_InputSource)._vptr_InputSource = (_func_int **)&PTR__FileInputSource_002e9d60;
  this->close_file = true;
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->filename,filename,&local_11);
  pFVar1 = QUtil::safe_fopen(filename,"rb");
  this->file = pFVar1;
  return;
}

Assistant:

FileInputSource::FileInputSource(char const* filename) :
    close_file(true),
    filename(filename),
    file(QUtil::safe_fopen(filename, "rb"))
{
}